

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O1

void __thiscall Cloner::~Cloner(Cloner *this)

{
  HashTable<StackSym_*,_Memory::ArenaAllocator> *this_00;
  JitArenaAllocator *pJVar1;
  HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator> *this_01;
  
  this_00 = this->symMap;
  if (this_00 != (HashTable<StackSym_*,_Memory::ArenaAllocator> *)0x0) {
    pJVar1 = this->alloc;
    HashTable<StackSym_*,_Memory::ArenaAllocator>::~HashTable(this_00);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)pJVar1,this_00,
               0x20);
  }
  this_01 = this->labelMap;
  if (this_01 != (HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator> *)0x0) {
    pJVar1 = this->alloc;
    HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator>::~HashTable(this_01);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)pJVar1,this_01,
               0x20);
  }
  return;
}

Assistant:

~Cloner()
    {
        if (symMap)
        {
            Adelete(alloc, symMap);
        }
        if (labelMap)
        {
            Adelete(alloc, labelMap);
        }
    }